

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3CreateIndex(Parse *pParse,Token *pName1,Token *pName2,SrcList *pTblName,ExprList *pList,
                       int onError,Token *pStart,Expr *pPIWhere,int sortOrder,int ifNotExist,
                       u8 idxType)

{
  byte *pbVar1;
  byte bVar2;
  u16 uVar3;
  short sVar4;
  ushort uVar5;
  sqlite3 *db;
  i16 *aiCol;
  u8 uVar6;
  i16 iVar7;
  int iVar8;
  uint iDb;
  int iVar9;
  uint uVar10;
  uint uVar11;
  Table *pTVar12;
  Db *pDVar13;
  char *zLeft;
  Index *pIVar14;
  Index **ppIVar15;
  Table *pTVar16;
  Expr *pEVar17;
  ExprList *pEVar18;
  CollSeq *pCVar19;
  void *pvVar20;
  Vdbe *p;
  Index *pIVar21;
  Index *pIVar22;
  ulong uVar23;
  ExprList_item *pEVar24;
  char *pcVar25;
  char *pcVar26;
  long lVar27;
  ulong local_e8;
  char *local_d0;
  Index *local_c8;
  ExprList *local_b8;
  long local_a8;
  char *zExtra;
  Token *local_98;
  long local_90;
  Token *pName;
  ulong local_80;
  char *local_78;
  Token prevCol;
  DbFixer sFix;
  
  db = pParse->db;
  pName = (Token *)0x0;
  zExtra = (char *)0x0;
  local_b8 = pList;
  if ((((db->mallocFailed == '\0') && (pParse->nErr < 1)) &&
      ((idxType == '\x02' || (pParse->declareVtab == '\0')))) &&
     (iVar8 = sqlite3ReadSchema(pParse), iVar8 == 0)) {
    if (pTblName == (SrcList *)0x0) {
      pTVar12 = pParse->pNewTable;
      if (pTVar12 != (Table *)0x0) {
        iDb = sqlite3SchemaToIndex(db,pTVar12->pSchema);
        local_98 = (Token *)0x0;
LAB_0024397e:
        local_c8 = (Index *)0x0;
LAB_0024399c:
        lVar27 = (long)(int)iDb * 0x20;
        pDVar13 = db->aDb + (int)iDb;
        zLeft = pTVar12->zName;
        iVar8 = sqlite3_strnicmp(zLeft,"sqlite_",7);
        if (((iVar8 == 0) && ((db->init).busy == '\0')) &&
           (iVar8 = sqlite3_strnicmp(zLeft + 7,"altertab_",9), iVar8 != 0)) {
          pcVar25 = "table %s may not be indexed";
          pcVar26 = (char *)0x0;
          goto LAB_00243a37;
        }
        if (pTVar12->pSelect == (Select *)0x0) {
          if (pTVar12->nModuleArg == 0) {
            local_90 = lVar27;
            if (local_98 == (Token *)0x0) {
              uVar23 = 1;
              for (ppIVar15 = &pTVar12->pIndex; *ppIVar15 != (Index *)0x0;
                  ppIVar15 = &(*ppIVar15)->pNext) {
                uVar23 = (ulong)((int)uVar23 + 1);
              }
              zLeft = sqlite3MPrintf(db,"sqlite_autoindex_%s_%d",zLeft,uVar23);
              if (zLeft != (char *)0x0) {
                if (pParse->declareVtab != '\0') {
                  zLeft[7] = zLeft[7] + '\x01';
                }
LAB_00243b04:
                pcVar26 = pDVar13->zDbSName;
                pcVar25 = "sqlite_master";
                if (iDb == 1) {
                  pcVar25 = "sqlite_temp_master";
                }
                iVar8 = sqlite3AuthCheck(pParse,0x12,pcVar25,(char *)0x0,pcVar26);
                if ((iVar8 != 0) ||
                   (iVar8 = sqlite3AuthCheck(pParse,(uint)(iDb == 1) * 2 + 1,zLeft,pTVar12->zName,
                                             pcVar26), iVar8 != 0)) goto LAB_00243809;
                if (pList == (ExprList *)0x0) {
                  prevCol.z = pTVar12->aCol[(long)pTVar12->nCol + -1].zName;
                  prevCol.n = sqlite3Strlen30(prevCol.z);
                  pEVar17 = sqlite3ExprAlloc(db,0x1b,&prevCol,0);
                  local_b8 = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pEVar17);
                  if (local_b8 == (ExprList *)0x0) {
                    local_b8 = (ExprList *)0x0;
                    goto LAB_00243809;
                  }
                  if (-1 < sortOrder) {
                    local_b8->a[(long)local_b8->nExpr + -1].sortOrder = (u8)sortOrder;
                  }
                }
                else {
                  sqlite3ExprListCheckLength(pParse,pList,"index");
                }
                uVar3 = 1;
                uVar11 = local_b8->nExpr;
                pEVar24 = local_b8->a;
                lVar27 = 0;
                uVar23 = 0;
                if (0 < (int)uVar11) {
                  uVar23 = (ulong)uVar11;
                }
                iVar8 = 0;
                for (; uVar23 << 5 != lVar27; lVar27 = lVar27 + 0x20) {
                  pcVar26 = *(char **)((long)&local_b8->a[0].pExpr + lVar27);
                  if (*pcVar26 == '^') {
                    iVar9 = sqlite3Strlen30(*(char **)(pcVar26 + 8));
                    iVar8 = iVar8 + iVar9 + 1;
                  }
                }
                uVar10 = sqlite3Strlen30(zLeft);
                if (local_c8 != (Index *)0x0) {
                  uVar3 = local_c8->nKeyCol;
                }
                pIVar14 = sqlite3AllocateIndexObject
                                    (db,uVar3 + (short)uVar11,uVar10 + iVar8 + 1,&zExtra);
                pcVar26 = zExtra;
                if (db->mallocFailed == '\0') {
                  pIVar14->zName = zExtra;
                  local_d0 = zExtra + (ulong)uVar10 + 1;
                  zExtra = local_d0;
                  memcpy(pcVar26,zLeft,(ulong)uVar10 + 1);
                  pIVar14->pTable = pTVar12;
                  pIVar14->onError = (u8)onError;
                  pIVar14->field_0x63 =
                       idxType & 3 | (onError != 0) << 3 | pIVar14->field_0x63 & 0xf4;
                  pIVar14->pSchema = *(Schema **)((long)&db->aDb->pSchema + local_90);
                  pIVar14->nKeyCol = (u16)local_b8->nExpr;
                  if (pPIWhere != (Expr *)0x0) {
                    sqlite3ResolveSelfReference(pParse,pTVar12,2,pPIWhere,(ExprList *)0x0);
                    pIVar14->pPartIdxWhere = pPIWhere;
                  }
                  bVar2 = pDVar13->pSchema->file_format;
                  local_a8 = 8;
                  pPIWhere = (Expr *)0x0;
                  for (local_e8 = 0; (long)local_e8 < (long)local_b8->nExpr; local_e8 = local_e8 + 1
                      ) {
                    sqlite3StringToId(pEVar24->pExpr);
                    sqlite3ResolveSelfReference(pParse,pTVar12,0x20,pEVar24->pExpr,(ExprList *)0x0);
                    if (pParse->nErr != 0) goto LAB_00243c7c;
                    pEVar17 = sqlite3ExprSkipCollate(pEVar24->pExpr);
                    if (pEVar17->op == 0x98) {
                      uVar11 = (uint)pEVar17->iColumn;
                      if ((int)uVar11 < 0) {
                        uVar11 = (uint)pTVar12->iPKey;
                      }
                      else if (pTVar12->aCol[uVar11].notNull == '\0') {
                        pIVar14->field_0x63 = pIVar14->field_0x63 & 0xf7;
                      }
                      pIVar14->aiColumn[local_e8] = (i16)uVar11;
                    }
                    else {
                      if (pTVar12 == pParse->pNewTable) {
                        pPIWhere = (Expr *)0x0;
                        sqlite3ErrorMsg(pParse,
                                        "expressions prohibited in PRIMARY KEY and UNIQUE constraints"
                                       );
                        goto LAB_00243c7c;
                      }
                      if (pIVar14->aColExpr == (ExprList *)0x0) {
                        pEVar18 = sqlite3ExprListDup(db,local_b8,0);
                        pIVar14->aColExpr = pEVar18;
                        if (db->mallocFailed == '\0') {
                          pEVar24 = (ExprList_item *)((long)pEVar18->a + local_a8 + -8);
                        }
                      }
                      pIVar14->aiColumn[local_e8] = -2;
                      pIVar14->field_0x63 = pIVar14->field_0x63 & 0xf7;
                      uVar11 = 0xfffffffe;
                    }
                    if (pEVar24->pExpr->op == '^') {
                      local_78 = (pEVar24->pExpr->u).zToken;
                      uVar11 = sqlite3Strlen30(local_78);
                      local_80 = (ulong)uVar11;
                      memcpy(local_d0,local_78,local_80 + 1);
                      zExtra = local_d0 + local_80 + 1;
                      pcVar26 = local_d0;
                      local_d0 = zExtra;
                    }
                    else if ((int)uVar11 < 0) {
                      pcVar26 = (char *)0x0;
                    }
                    else {
                      pcVar26 = pTVar12->aCol[uVar11].zColl;
                    }
                    pcVar25 = "BINARY";
                    if (pcVar26 != (char *)0x0) {
                      pcVar25 = pcVar26;
                    }
                    if (((db->init).busy == '\0') &&
                       (pCVar19 = sqlite3LocateCollSeq(pParse,pcVar25), pCVar19 == (CollSeq *)0x0))
                    goto LAB_00243c7c;
                    uVar6 = '\0';
                    pIVar14->azColl[local_e8] = pcVar25;
                    if (3 < bVar2) {
                      uVar6 = (u8)*(undefined4 *)&pEVar24->sortOrder;
                    }
                    pIVar14->aSortOrder[local_e8] = uVar6;
                    pEVar24 = pEVar24 + 1;
                    local_a8 = local_a8 + 0x20;
                  }
                  if (local_c8 == (Index *)0x0) {
                    pIVar14->aiColumn[local_e8] = -1;
                    pIVar14->azColl[local_e8] = "BINARY";
                  }
                  else {
                    for (uVar23 = 0; uVar23 < local_c8->nKeyCol; uVar23 = uVar23 + 1) {
                      sVar4 = local_c8->aiColumn[uVar23];
                      aiCol = pIVar14->aiColumn;
                      iVar8 = hasColumn(aiCol,(uint)pIVar14->nKeyCol,(int)sVar4);
                      if (iVar8 == 0) {
                        iVar8 = (int)local_e8;
                        aiCol[iVar8] = sVar4;
                        pIVar14->azColl[iVar8] = local_c8->azColl[uVar23];
                        pIVar14->aSortOrder[iVar8] = local_c8->aSortOrder[uVar23];
                        local_e8 = (ulong)(iVar8 + 1);
                      }
                      else {
                        pIVar14->nColumn = pIVar14->nColumn - 1;
                      }
                    }
                  }
                  sqlite3DefaultRowEst(pIVar14);
                  if (pParse->pNewTable == (Table *)0x0) {
                    estimateIndexWidth(pIVar14);
                  }
                  if ((pTblName != (SrcList *)0x0) &&
                     ((int)pTVar12->nCol <= (int)(uint)pIVar14->nColumn)) {
                    bVar2 = pIVar14->field_0x63;
                    pIVar14->field_0x63 = bVar2 | 0x20;
                    uVar11 = (uint)(ushort)pTVar12->nCol;
                    uVar10 = 0;
                    if (pTVar12->nCol < 1) {
                      uVar11 = 0;
                    }
                    for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
                      if ((uVar10 != (int)pTVar12->iPKey) &&
                         (iVar7 = sqlite3ColumnOfIndex(pIVar14,(i16)uVar10), iVar7 < 0)) {
                        pIVar14->field_0x63 = bVar2 & 0xdf;
                        break;
                      }
                    }
                  }
                  if (pTVar12 == pParse->pNewTable) {
                    ppIVar15 = &pTVar12->pIndex;
                    while (pIVar22 = *ppIVar15, pIVar22 != (Index *)0x0) {
                      uVar5 = pIVar22->nKeyCol;
                      if (uVar5 == pIVar14->nKeyCol) {
                        uVar23 = 0;
                        do {
                          if (uVar5 == uVar23) {
                            uVar6 = pIVar22->onError;
                            if (uVar6 != pIVar14->onError) {
                              if ((uVar6 != '\n') && (pIVar14->onError != '\n')) {
                                sqlite3ErrorMsg(pParse,"conflicting ON CONFLICT clauses specified",0
                                               );
                                uVar6 = pIVar22->onError;
                              }
                              if (uVar6 == '\n') {
                                pIVar22->onError = pIVar14->onError;
                              }
                            }
                            if (idxType == '\x02') {
                              pIVar22->field_0x63 = pIVar22->field_0x63 & 0xfc | 2;
                            }
                            goto LAB_0024427a;
                          }
                          if (pIVar22->aiColumn[uVar23] != pIVar14->aiColumn[uVar23]) break;
                          iVar8 = sqlite3StrICmp(pIVar22->azColl[uVar23],pIVar14->azColl[uVar23]);
                          uVar23 = uVar23 + 1;
                        } while (iVar8 == 0);
                      }
                      ppIVar15 = &pIVar22->pNext;
                    }
                  }
                  if ((db->init).busy == '\0') {
                    if ((pTblName == (SrcList *)0x0) && ((pTVar12->tabFlags & 0x20) != 0)) {
LAB_00244439:
                      if ((pTblName == (SrcList *)0x0) || ((db->init).busy != '\0')) {
                        pIVar22 = pTVar12->pIndex;
                        if (onError == 5) {
                          if (pIVar22 == (Index *)0x0) {
                            pIVar22 = (Index *)0x0;
                            goto LAB_0024448d;
                          }
                          if (pIVar22->onError == '\x05') goto LAB_0024448d;
                          do {
                            pIVar21 = pIVar22;
                            pIVar22 = pIVar21->pNext;
                            if (pIVar22 == (Index *)0x0) break;
                          } while (pIVar22->onError != '\x05');
                          pIVar14->pNext = pIVar22;
                          pIVar21->pNext = pIVar14;
                        }
                        else {
LAB_0024448d:
                          pIVar14->pNext = pIVar22;
                          pTVar12->pIndex = pIVar14;
                        }
                        pPIWhere = (Expr *)0x0;
                        goto LAB_00243809;
                      }
                    }
                    else {
                      uVar11 = pParse->nMem + 1;
                      pParse->nMem = uVar11;
                      p = sqlite3GetVdbe(pParse);
                      if (p != (Vdbe *)0x0) {
                        sqlite3BeginWriteOperation(pParse,1,iDb);
                        iVar8 = sqlite3VdbeAddOp0(p,0xa6);
                        pIVar14->tnum = iVar8;
                        sqlite3VdbeAddOp2(p,0x86,iDb,uVar11);
                        if (pStart == (Token *)0x0) {
                          pcVar26 = (char *)0x0;
                        }
                        else {
                          iVar8 = (*(int *)&(pParse->sLastToken).z - (int)local_98->z) +
                                  (pParse->sLastToken).n;
                          pcVar26 = " UNIQUE";
                          if (onError == 0) {
                            pcVar26 = "";
                          }
                          pcVar26 = sqlite3MPrintf(db,"CREATE%s INDEX %.*s",pcVar26,
                                                   (ulong)(iVar8 - (uint)(local_98->z
                                                                          [(long)iVar8 + -1] == ';')
                                                          ));
                        }
                        sqlite3NestedParse(pParse,
                                           "INSERT INTO %Q.%s VALUES(\'index\',%Q,%Q,#%d,%Q);",
                                           *(undefined8 *)((long)&db->aDb->zDbSName + local_90),
                                           "sqlite_master",pIVar14->zName,pTVar12->zName,
                                           (ulong)uVar11,pcVar26);
                        sqlite3DbFree(db,pcVar26);
                        if (pTblName != (SrcList *)0x0) {
                          sqlite3RefillIndex(pParse,pIVar14,uVar11);
                          sqlite3ChangeCookie(pParse,iDb);
                          pcVar26 = sqlite3MPrintf(db,"name=\'%q\' AND type=\'index\'",
                                                   pIVar14->zName);
                          sqlite3VdbeAddParseSchemaOp(p,iDb,pcVar26);
                          sqlite3VdbeAddOp0(p,0x97);
                        }
                        sqlite3VdbeJumpHere(p,pIVar14->tnum);
                        goto LAB_00244439;
                      }
                    }
                    pPIWhere = (Expr *)0x0;
                    goto LAB_00243c70;
                  }
                  pvVar20 = sqlite3HashInsert(&pIVar14->pSchema->idxHash,pIVar14->zName,pIVar14);
                  if (pvVar20 == (void *)0x0) {
                    pbVar1 = (byte *)((long)&db->flags + 2);
                    *pbVar1 = *pbVar1 | 0x80;
                    if (pTblName != (SrcList *)0x0) {
                      pIVar14->tnum = (db->init).newTnum;
                    }
                    goto LAB_00244439;
                  }
                  sqlite3OomFault(db);
LAB_0024427a:
                  pPIWhere = (Expr *)0x0;
                }
                else {
LAB_00243c70:
                  if (pIVar14 == (Index *)0x0) goto LAB_00243809;
                }
LAB_00243c7c:
                freeIndex(db,pIVar14);
                goto LAB_00243809;
              }
            }
            else {
              zLeft = sqlite3NameFromToken(db,local_98);
              if (zLeft != (char *)0x0) {
                iVar8 = sqlite3CheckObjectName(pParse,zLeft);
                if (iVar8 != 0) goto LAB_00243809;
                pcVar26 = zLeft;
                if (((db->init).busy == '\0') &&
                   (pTVar16 = sqlite3FindTable(db,zLeft,(char *)0x0), pTVar16 != (Table *)0x0)) {
                  pcVar25 = "there is already a table named %s";
                }
                else {
                  pIVar14 = sqlite3FindIndex(db,zLeft,pDVar13->zDbSName);
                  if (pIVar14 == (Index *)0x0) goto LAB_00243b04;
                  if (ifNotExist != 0) {
                    sqlite3CodeVerifySchema(pParse,iDb);
                    goto LAB_00243809;
                  }
                  pcVar25 = "index %s already exists";
                }
                goto LAB_00243a37;
              }
            }
            goto LAB_00243806;
          }
          pcVar26 = "virtual tables may not be indexed";
        }
        else {
          pcVar26 = "views may not be indexed";
        }
        zLeft = (char *)0x0;
        sqlite3ErrorMsg(pParse,pcVar26);
        goto LAB_00243809;
      }
    }
    else {
      iDb = sqlite3TwoPartName(pParse,pName1,pName2,&pName);
      if (-1 < (int)iDb) {
        if ((((db->init).busy == '\0') &&
            (pTVar12 = sqlite3SrcListLookup(pParse,pTblName),
            pTVar12 != (Table *)0x0 && pName2->n == 0)) && (pTVar12->pSchema == db->aDb[1].pSchema))
        {
          iDb = 1;
        }
        pDVar13 = pParse->db->aDb;
        sFix.zDb = pDVar13[iDb].zDbSName;
        sFix.pSchema = pDVar13[iDb].pSchema;
        sFix.zType = "index";
        local_98 = pName;
        sFix.pName = pName;
        sFix.bVarOnly = (int)(iDb == 1);
        sFix.pParse = pParse;
        sqlite3FixSrcList(&sFix,pTblName);
        pTVar12 = sqlite3LocateTableItem(pParse,0,pTblName->a);
        zLeft = (char *)0x0;
        if (pTVar12 == (Table *)0x0) goto LAB_00243809;
        if ((iDb != 1) || (db->aDb[1].pSchema == pTVar12->pSchema)) {
          if ((pTVar12->tabFlags & 0x20) == 0) goto LAB_0024397e;
          local_c8 = sqlite3PrimaryKeyIndex(pTVar12);
          goto LAB_0024399c;
        }
        zLeft = pTVar12->zName;
        pcVar25 = "cannot create a TEMP index on non-TEMP table \"%s\"";
        pcVar26 = (char *)0x0;
LAB_00243a37:
        sqlite3ErrorMsg(pParse,pcVar25,zLeft);
        zLeft = pcVar26;
        goto LAB_00243809;
      }
    }
  }
LAB_00243806:
  zLeft = (char *)0x0;
LAB_00243809:
  sqlite3ExprDelete(db,pPIWhere);
  sqlite3ExprListDelete(db,local_b8);
  sqlite3SrcListDelete(db,pTblName);
  sqlite3DbFree(db,zLeft);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateIndex(
  Parse *pParse,     /* All information about this parse */
  Token *pName1,     /* First part of index name. May be NULL */
  Token *pName2,     /* Second part of index name. May be NULL */
  SrcList *pTblName, /* Table to index. Use pParse->pNewTable if 0 */
  ExprList *pList,   /* A list of columns to be indexed */
  int onError,       /* OE_Abort, OE_Ignore, OE_Replace, or OE_None */
  Token *pStart,     /* The CREATE token that begins this statement */
  Expr *pPIWhere,    /* WHERE clause for partial indices */
  int sortOrder,     /* Sort order of primary key when pList==NULL */
  int ifNotExist,    /* Omit error if index already exists */
  u8 idxType         /* The index type */
){
  Table *pTab = 0;     /* Table to be indexed */
  Index *pIndex = 0;   /* The index to be created */
  char *zName = 0;     /* Name of the index */
  int nName;           /* Number of characters in zName */
  int i, j;
  DbFixer sFix;        /* For assigning database names to pTable */
  int sortOrderMask;   /* 1 to honor DESC in index.  0 to ignore. */
  sqlite3 *db = pParse->db;
  Db *pDb;             /* The specific table containing the indexed database */
  int iDb;             /* Index of the database that is being written */
  Token *pName = 0;    /* Unqualified name of the index to create */
  struct ExprList_item *pListItem; /* For looping over pList */
  int nExtra = 0;                  /* Space allocated for zExtra[] */
  int nExtraCol;                   /* Number of extra columns needed */
  char *zExtra = 0;                /* Extra space after the Index object */
  Index *pPk = 0;      /* PRIMARY KEY index for WITHOUT ROWID tables */

  if( db->mallocFailed || pParse->nErr>0 ){
    goto exit_create_index;
  }
  if( IN_DECLARE_VTAB && idxType!=SQLITE_IDXTYPE_PRIMARYKEY ){
    goto exit_create_index;
  }
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto exit_create_index;
  }

  /*
  ** Find the table that is to be indexed.  Return early if not found.
  */
  if( pTblName!=0 ){

    /* Use the two-part index name to determine the database 
    ** to search for the table. 'Fix' the table name to this db
    ** before looking up the table.
    */
    assert( pName1 && pName2 );
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ) goto exit_create_index;
    assert( pName && pName->z );

#ifndef SQLITE_OMIT_TEMPDB
    /* If the index name was unqualified, check if the table
    ** is a temp table. If so, set the database to 1. Do not do this
    ** if initialising a database schema.
    */
    if( !db->init.busy ){
      pTab = sqlite3SrcListLookup(pParse, pTblName);
      if( pName2->n==0 && pTab && pTab->pSchema==db->aDb[1].pSchema ){
        iDb = 1;
      }
    }
#endif

    sqlite3FixInit(&sFix, pParse, iDb, "index", pName);
    if( sqlite3FixSrcList(&sFix, pTblName) ){
      /* Because the parser constructs pTblName from a single identifier,
      ** sqlite3FixSrcList can never fail. */
      assert(0);
    }
    pTab = sqlite3LocateTableItem(pParse, 0, &pTblName->a[0]);
    assert( db->mallocFailed==0 || pTab==0 );
    if( pTab==0 ) goto exit_create_index;
    if( iDb==1 && db->aDb[iDb].pSchema!=pTab->pSchema ){
      sqlite3ErrorMsg(pParse, 
           "cannot create a TEMP index on non-TEMP table \"%s\"",
           pTab->zName);
      goto exit_create_index;
    }
    if( !HasRowid(pTab) ) pPk = sqlite3PrimaryKeyIndex(pTab);
  }else{
    assert( pName==0 );
    assert( pStart==0 );
    pTab = pParse->pNewTable;
    if( !pTab ) goto exit_create_index;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  }
  pDb = &db->aDb[iDb];

  assert( pTab!=0 );
  assert( pParse->nErr==0 );
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 
       && db->init.busy==0
#if SQLITE_USER_AUTHENTICATION
       && sqlite3UserAuthTable(pTab->zName)==0
#endif
       && sqlite3StrNICmp(&pTab->zName[7],"altertab_",9)!=0 ){
    sqlite3ErrorMsg(pParse, "table %s may not be indexed", pTab->zName);
    goto exit_create_index;
  }
#ifndef SQLITE_OMIT_VIEW
  if( pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "views may not be indexed");
    goto exit_create_index;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be indexed");
    goto exit_create_index;
  }
#endif

  /*
  ** Find the name of the index.  Make sure there is not already another
  ** index or table with the same name.  
  **
  ** Exception:  If we are reading the names of permanent indices from the
  ** sqlite_master table (because some other process changed the schema) and
  ** one of the index names collides with the name of a temporary table or
  ** index, then we will continue to process this index.
  **
  ** If pName==0 it means that we are
  ** dealing with a primary key or UNIQUE constraint.  We have to invent our
  ** own name.
  */
  if( pName ){
    zName = sqlite3NameFromToken(db, pName);
    if( zName==0 ) goto exit_create_index;
    assert( pName->z!=0 );
    if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){
      goto exit_create_index;
    }
    if( !db->init.busy ){
      if( sqlite3FindTable(db, zName, 0)!=0 ){
        sqlite3ErrorMsg(pParse, "there is already a table named %s", zName);
        goto exit_create_index;
      }
    }
    if( sqlite3FindIndex(db, zName, pDb->zDbSName)!=0 ){
      if( !ifNotExist ){
        sqlite3ErrorMsg(pParse, "index %s already exists", zName);
      }else{
        assert( !db->init.busy );
        sqlite3CodeVerifySchema(pParse, iDb);
      }
      goto exit_create_index;
    }
  }else{
    int n;
    Index *pLoop;
    for(pLoop=pTab->pIndex, n=1; pLoop; pLoop=pLoop->pNext, n++){}
    zName = sqlite3MPrintf(db, "sqlite_autoindex_%s_%d", pTab->zName, n);
    if( zName==0 ){
      goto exit_create_index;
    }

    /* Automatic index names generated from within sqlite3_declare_vtab()
    ** must have names that are distinct from normal automatic index names.
    ** The following statement converts "sqlite3_autoindex..." into
    ** "sqlite3_butoindex..." in order to make the names distinct.
    ** The "vtab_err.test" test demonstrates the need of this statement. */
    if( IN_DECLARE_VTAB ) zName[7]++;
  }

  /* Check for authorization to create an index.
  */
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    const char *zDb = pDb->zDbSName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iDb), 0, zDb) ){
      goto exit_create_index;
    }
    i = SQLITE_CREATE_INDEX;
    if( !OMIT_TEMPDB && iDb==1 ) i = SQLITE_CREATE_TEMP_INDEX;
    if( sqlite3AuthCheck(pParse, i, zName, pTab->zName, zDb) ){
      goto exit_create_index;
    }
  }
#endif

  /* If pList==0, it means this routine was called to make a primary
  ** key out of the last column added to the table under construction.
  ** So create a fake list to simulate this.
  */
  if( pList==0 ){
    Token prevCol;
    sqlite3TokenInit(&prevCol, pTab->aCol[pTab->nCol-1].zName);
    pList = sqlite3ExprListAppend(pParse, 0,
              sqlite3ExprAlloc(db, TK_ID, &prevCol, 0));
    if( pList==0 ) goto exit_create_index;
    assert( pList->nExpr==1 );
    sqlite3ExprListSetSortOrder(pList, sortOrder);
  }else{
    sqlite3ExprListCheckLength(pParse, pList, "index");
  }

  /* Figure out how many bytes of space are required to store explicitly
  ** specified collation sequence names.
  */
  for(i=0; i<pList->nExpr; i++){
    Expr *pExpr = pList->a[i].pExpr;
    assert( pExpr!=0 );
    if( pExpr->op==TK_COLLATE ){
      nExtra += (1 + sqlite3Strlen30(pExpr->u.zToken));
    }
  }

  /* 
  ** Allocate the index structure. 
  */
  nName = sqlite3Strlen30(zName);
  nExtraCol = pPk ? pPk->nKeyCol : 1;
  pIndex = sqlite3AllocateIndexObject(db, pList->nExpr + nExtraCol,
                                      nName + nExtra + 1, &zExtra);
  if( db->mallocFailed ){
    goto exit_create_index;
  }
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->aiRowLogEst) );
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->azColl) );
  pIndex->zName = zExtra;
  zExtra += nName + 1;
  memcpy(pIndex->zName, zName, nName+1);
  pIndex->pTable = pTab;
  pIndex->onError = (u8)onError;
  pIndex->uniqNotNull = onError!=OE_None;
  pIndex->idxType = idxType;
  pIndex->pSchema = db->aDb[iDb].pSchema;
  pIndex->nKeyCol = pList->nExpr;
  if( pPIWhere ){
    sqlite3ResolveSelfReference(pParse, pTab, NC_PartIdx, pPIWhere, 0);
    pIndex->pPartIdxWhere = pPIWhere;
    pPIWhere = 0;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );

  /* Check to see if we should honor DESC requests on index columns
  */
  if( pDb->pSchema->file_format>=4 ){
    sortOrderMask = -1;   /* Honor DESC */
  }else{
    sortOrderMask = 0;    /* Ignore DESC */
  }

  /* Analyze the list of expressions that form the terms of the index and
  ** report any errors.  In the common case where the expression is exactly
  ** a table column, store that column in aiColumn[].  For general expressions,
  ** populate pIndex->aColExpr and store XN_EXPR (-2) in aiColumn[].
  **
  ** TODO: Issue a warning if two or more columns of the index are identical.
  ** TODO: Issue a warning if the table primary key is used as part of the
  ** index key.
  */
  for(i=0, pListItem=pList->a; i<pList->nExpr; i++, pListItem++){
    Expr *pCExpr;                  /* The i-th index expression */
    int requestedSortOrder;        /* ASC or DESC on the i-th expression */
    const char *zColl;             /* Collation sequence name */

    sqlite3StringToId(pListItem->pExpr);
    sqlite3ResolveSelfReference(pParse, pTab, NC_IdxExpr, pListItem->pExpr, 0);
    if( pParse->nErr ) goto exit_create_index;
    pCExpr = sqlite3ExprSkipCollate(pListItem->pExpr);
    if( pCExpr->op!=TK_COLUMN ){
      if( pTab==pParse->pNewTable ){
        sqlite3ErrorMsg(pParse, "expressions prohibited in PRIMARY KEY and "
                                "UNIQUE constraints");
        goto exit_create_index;
      }
      if( pIndex->aColExpr==0 ){
        ExprList *pCopy = sqlite3ExprListDup(db, pList, 0);
        pIndex->aColExpr = pCopy;
        if( !db->mallocFailed ){
          assert( pCopy!=0 );
          pListItem = &pCopy->a[i];
        }
      }
      j = XN_EXPR;
      pIndex->aiColumn[i] = XN_EXPR;
      pIndex->uniqNotNull = 0;
    }else{
      j = pCExpr->iColumn;
      assert( j<=0x7fff );
      if( j<0 ){
        j = pTab->iPKey;
      }else if( pTab->aCol[j].notNull==0 ){
        pIndex->uniqNotNull = 0;
      }
      pIndex->aiColumn[i] = (i16)j;
    }
    zColl = 0;
    if( pListItem->pExpr->op==TK_COLLATE ){
      int nColl;
      zColl = pListItem->pExpr->u.zToken;
      nColl = sqlite3Strlen30(zColl) + 1;
      assert( nExtra>=nColl );
      memcpy(zExtra, zColl, nColl);
      zColl = zExtra;
      zExtra += nColl;
      nExtra -= nColl;
    }else if( j>=0 ){
      zColl = pTab->aCol[j].zColl;
    }
    if( !zColl ) zColl = sqlite3StrBINARY;
    if( !db->init.busy && !sqlite3LocateCollSeq(pParse, zColl) ){
      goto exit_create_index;
    }
    pIndex->azColl[i] = zColl;
    requestedSortOrder = pListItem->sortOrder & sortOrderMask;
    pIndex->aSortOrder[i] = (u8)requestedSortOrder;
  }

  /* Append the table key to the end of the index.  For WITHOUT ROWID
  ** tables (when pPk!=0) this will be the declared PRIMARY KEY.  For
  ** normal tables (when pPk==0) this will be the rowid.
  */
  if( pPk ){
    for(j=0; j<pPk->nKeyCol; j++){
      int x = pPk->aiColumn[j];
      assert( x>=0 );
      if( hasColumn(pIndex->aiColumn, pIndex->nKeyCol, x) ){
        pIndex->nColumn--; 
      }else{
        pIndex->aiColumn[i] = x;
        pIndex->azColl[i] = pPk->azColl[j];
        pIndex->aSortOrder[i] = pPk->aSortOrder[j];
        i++;
      }
    }
    assert( i==pIndex->nColumn );
  }else{
    pIndex->aiColumn[i] = XN_ROWID;
    pIndex->azColl[i] = sqlite3StrBINARY;
  }
  sqlite3DefaultRowEst(pIndex);
  if( pParse->pNewTable==0 ) estimateIndexWidth(pIndex);

  /* If this index contains every column of its table, then mark
  ** it as a covering index */
  assert( HasRowid(pTab) 
      || pTab->iPKey<0 || sqlite3ColumnOfIndex(pIndex, pTab->iPKey)>=0 );
  if( pTblName!=0 && pIndex->nColumn>=pTab->nCol ){
    pIndex->isCovering = 1;
    for(j=0; j<pTab->nCol; j++){
      if( j==pTab->iPKey ) continue;
      if( sqlite3ColumnOfIndex(pIndex,j)>=0 ) continue;
      pIndex->isCovering = 0;
      break;
    }
  }

  if( pTab==pParse->pNewTable ){
    /* This routine has been called to create an automatic index as a
    ** result of a PRIMARY KEY or UNIQUE clause on a column definition, or
    ** a PRIMARY KEY or UNIQUE clause following the column definitions.
    ** i.e. one of:
    **
    ** CREATE TABLE t(x PRIMARY KEY, y);
    ** CREATE TABLE t(x, y, UNIQUE(x, y));
    **
    ** Either way, check to see if the table already has such an index. If
    ** so, don't bother creating this one. This only applies to
    ** automatically created indices. Users can do as they wish with
    ** explicit indices.
    **
    ** Two UNIQUE or PRIMARY KEY constraints are considered equivalent
    ** (and thus suppressing the second one) even if they have different
    ** sort orders.
    **
    ** If there are different collating sequences or if the columns of
    ** the constraint occur in different orders, then the constraints are
    ** considered distinct and both result in separate indices.
    */
    Index *pIdx;
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      int k;
      assert( IsUniqueIndex(pIdx) );
      assert( pIdx->idxType!=SQLITE_IDXTYPE_APPDEF );
      assert( IsUniqueIndex(pIndex) );

      if( pIdx->nKeyCol!=pIndex->nKeyCol ) continue;
      for(k=0; k<pIdx->nKeyCol; k++){
        const char *z1;
        const char *z2;
        assert( pIdx->aiColumn[k]>=0 );
        if( pIdx->aiColumn[k]!=pIndex->aiColumn[k] ) break;
        z1 = pIdx->azColl[k];
        z2 = pIndex->azColl[k];
        if( sqlite3StrICmp(z1, z2) ) break;
      }
      if( k==pIdx->nKeyCol ){
        if( pIdx->onError!=pIndex->onError ){
          /* This constraint creates the same index as a previous
          ** constraint specified somewhere in the CREATE TABLE statement.
          ** However the ON CONFLICT clauses are different. If both this 
          ** constraint and the previous equivalent constraint have explicit
          ** ON CONFLICT clauses this is an error. Otherwise, use the
          ** explicitly specified behavior for the index.
          */
          if( !(pIdx->onError==OE_Default || pIndex->onError==OE_Default) ){
            sqlite3ErrorMsg(pParse, 
                "conflicting ON CONFLICT clauses specified", 0);
          }
          if( pIdx->onError==OE_Default ){
            pIdx->onError = pIndex->onError;
          }
        }
        if( idxType==SQLITE_IDXTYPE_PRIMARYKEY ) pIdx->idxType = idxType;
        goto exit_create_index;
      }
    }
  }

  /* Link the new Index structure to its table and to the other
  ** in-memory database structures. 
  */
  assert( pParse->nErr==0 );
  if( db->init.busy ){
    Index *p;
    assert( !IN_DECLARE_VTAB );
    assert( sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
    p = sqlite3HashInsert(&pIndex->pSchema->idxHash, 
                          pIndex->zName, pIndex);
    if( p ){
      assert( p==pIndex );  /* Malloc must have failed */
      sqlite3OomFault(db);
      goto exit_create_index;
    }
    db->flags |= SQLITE_InternChanges;
    if( pTblName!=0 ){
      pIndex->tnum = db->init.newTnum;
    }
  }

  /* If this is the initial CREATE INDEX statement (or CREATE TABLE if the
  ** index is an implied index for a UNIQUE or PRIMARY KEY constraint) then
  ** emit code to allocate the index rootpage on disk and make an entry for
  ** the index in the sqlite_master table and populate the index with
  ** content.  But, do not do this if we are simply reading the sqlite_master
  ** table to parse the schema, or if this index is the PRIMARY KEY index
  ** of a WITHOUT ROWID table.
  **
  ** If pTblName==0 it means this index is generated as an implied PRIMARY KEY
  ** or UNIQUE index in a CREATE TABLE statement.  Since the table
  ** has just been created, it contains no data and the index initialization
  ** step can be skipped.
  */
  else if( HasRowid(pTab) || pTblName!=0 ){
    Vdbe *v;
    char *zStmt;
    int iMem = ++pParse->nMem;

    v = sqlite3GetVdbe(pParse);
    if( v==0 ) goto exit_create_index;

    sqlite3BeginWriteOperation(pParse, 1, iDb);

    /* Create the rootpage for the index using CreateIndex. But before
    ** doing so, code a Noop instruction and store its address in 
    ** Index.tnum. This is required in case this index is actually a 
    ** PRIMARY KEY and the table is actually a WITHOUT ROWID table. In 
    ** that case the convertToWithoutRowidTable() routine will replace
    ** the Noop with a Goto to jump over the VDBE code generated below. */
    pIndex->tnum = sqlite3VdbeAddOp0(v, OP_Noop);
    sqlite3VdbeAddOp2(v, OP_CreateIndex, iDb, iMem);

    /* Gather the complete text of the CREATE INDEX statement into
    ** the zStmt variable
    */
    if( pStart ){
      int n = (int)(pParse->sLastToken.z - pName->z) + pParse->sLastToken.n;
      if( pName->z[n-1]==';' ) n--;
      /* A named index with an explicit CREATE INDEX statement */
      zStmt = sqlite3MPrintf(db, "CREATE%s INDEX %.*s",
        onError==OE_None ? "" : " UNIQUE", n, pName->z);
    }else{
      /* An automatic index created by a PRIMARY KEY or UNIQUE constraint */
      /* zStmt = sqlite3MPrintf(""); */
      zStmt = 0;
    }

    /* Add an entry in sqlite_master for this index
    */
    sqlite3NestedParse(pParse, 
        "INSERT INTO %Q.%s VALUES('index',%Q,%Q,#%d,%Q);",
        db->aDb[iDb].zDbSName, MASTER_NAME,
        pIndex->zName,
        pTab->zName,
        iMem,
        zStmt
    );
    sqlite3DbFree(db, zStmt);

    /* Fill the index with data and reparse the schema. Code an OP_Expire
    ** to invalidate all pre-compiled statements.
    */
    if( pTblName ){
      sqlite3RefillIndex(pParse, pIndex, iMem);
      sqlite3ChangeCookie(pParse, iDb);
      sqlite3VdbeAddParseSchemaOp(v, iDb,
         sqlite3MPrintf(db, "name='%q' AND type='index'", pIndex->zName));
      sqlite3VdbeAddOp0(v, OP_Expire);
    }

    sqlite3VdbeJumpHere(v, pIndex->tnum);
  }

  /* When adding an index to the list of indices for a table, make
  ** sure all indices labeled OE_Replace come after all those labeled
  ** OE_Ignore.  This is necessary for the correct constraint check
  ** processing (in sqlite3GenerateConstraintChecks()) as part of
  ** UPDATE and INSERT statements.  
  */
  if( db->init.busy || pTblName==0 ){
    if( onError!=OE_Replace || pTab->pIndex==0
         || pTab->pIndex->onError==OE_Replace){
      pIndex->pNext = pTab->pIndex;
      pTab->pIndex = pIndex;
    }else{
      Index *pOther = pTab->pIndex;
      while( pOther->pNext && pOther->pNext->onError!=OE_Replace ){
        pOther = pOther->pNext;
      }
      pIndex->pNext = pOther->pNext;
      pOther->pNext = pIndex;
    }
    pIndex = 0;
  }

  /* Clean up before exiting */
exit_create_index:
  if( pIndex ) freeIndex(db, pIndex);
  sqlite3ExprDelete(db, pPIWhere);
  sqlite3ExprListDelete(db, pList);
  sqlite3SrcListDelete(db, pTblName);
  sqlite3DbFree(db, zName);
}